

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_dependentFunctionType_primitiveAnalyzeAndTypeCheckMessageSendNode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  long lVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t *psVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  anon_struct_72_9_c796e810 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameFunctionActivationRecord_t functionActivationRecord;
  sysbvm_tuple_t local_1a8;
  sysbvm_tuple_t sStack_1a0;
  sysbvm_tuple_t local_198;
  sysbvm_tuple_t sStack_190;
  sysbvm_tuple_t local_188;
  sysbvm_tuple_t sStack_180;
  sysbvm_tuple_t local_178;
  sysbvm_tuple_t sStack_170;
  sysbvm_tuple_t local_168;
  sysbvm_stackFrameRecord_t local_160;
  undefined8 local_150;
  sysbvm_stackFrameRecord_t local_148;
  undefined8 local_138;
  sysbvm_tuple_t *psStack_130;
  sysbvm_stackFrameRecord_t local_128 [15];
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  local_178 = 0;
  sStack_170 = 0;
  local_188 = 0;
  sStack_180 = 0;
  local_198 = 0;
  sStack_190 = 0;
  sStack_1a0 = 0;
  uVar7 = 0;
  local_168 = 0;
  local_1a8 = arguments[1];
  memset(local_128,0,0xf8);
  local_128[0].type = SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION;
  sysbvm_stackFrame_pushRecord(local_128);
  local_148.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_148.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_148._12_4_ = 0;
  local_138 = 9;
  psStack_130 = &local_1a8;
  sysbvm_stackFrame_pushRecord(&local_148);
  local_160.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_160.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_150 = *(undefined8 *)(local_1a8 + 0x10);
  sysbvm_stackFrame_pushRecord(&local_160);
  sStack_1a0 = sysbvm_functionActivationEnvironment_createForDependentFunctionType
                         (context,0,*arguments);
  uVar5 = *(ulong *)(*arguments + 0x108);
  if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
    uVar7 = (ulong)(*(uint *)(uVar5 + 0xc) >> 3);
  }
  uVar5 = *(ulong *)(local_1a8 + 0x40);
  if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
    sVar3 = (sysbvm_tuple_t)(*(uint *)(uVar5 + 0xc) >> 3);
  }
  else {
    sVar3 = 0;
  }
  sStack_170 = sysbvm_array_create(context,sVar3);
  uVar5 = 0;
  if (uVar7 != 0) {
    uVar6 = 0;
    bVar8 = false;
    do {
      uVar1 = *(ulong *)(*arguments + 0x108);
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        local_198 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar6 * 8);
      }
      else {
        local_198 = 0;
      }
      if (((uVar7 & 0xf) == 0) && (*(long *)(uVar7 + 0x28) == 0x1f)) {
        sysbvm_error("TODO: Support forall argument types");
      }
      else {
        if (bVar8) {
          bVar9 = false;
        }
        else {
          bVar9 = *(long *)(local_1a8 + 0x28) != 0;
        }
        if (bVar9 == false) {
          if (sVar3 <= uVar5) {
            sysbvm_error("Message send is missing required arguments.");
          }
          uVar1 = *(ulong *)(local_1a8 + 0x40);
          if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
            sStack_190 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar5 * 8);
          }
          else {
            sStack_190 = 0;
          }
        }
        else {
          sStack_190 = *(sysbvm_tuple_t *)(local_1a8 + 0x28);
        }
        local_168 = sysbvm_interpreter_evaluateArgumentNodeTypeInEnvironment
                              (context,local_198,&sStack_1a0);
        local_178 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                              (context,sStack_190,local_168,arguments[2]);
        if (bVar9 == false) {
          if ((sStack_170 & 0xf) == 0 && sStack_170 != 0) {
            psVar4 = (sysbvm_tuple_t *)(sStack_170 + uVar5 * 8 + 0x10);
            goto LAB_0012b7e2;
          }
        }
        else {
          psVar4 = (sysbvm_tuple_t *)(local_1a8 + 0x28);
LAB_0012b7e2:
          *psVar4 = local_178;
        }
        local_188 = sysbvm_dependentFunctionType_getOrCreateDependentApplicationValueForNode
                              (context,local_178);
        uVar1 = *(ulong *)(sStack_1a0 + 0xa0);
        if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
          *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar6 * 8) = local_188;
        }
        if (bVar9 != false) {
          bVar8 = true;
        }
        uVar5 = uVar5 + (bVar9 ^ 1);
      }
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  if (uVar5 != sVar3) {
    sysbvm_error("Message send is not receiving the expected number of arguments.");
  }
  *(sysbvm_tuple_t *)(local_1a8 + 0x40) = sStack_170;
  if (*(sysbvm_tuple_t *)(*arguments + 0x110) != 0) {
    sStack_180 = sysbvm_interpreter_evaluateASTWithEnvironment
                           (context,*(sysbvm_tuple_t *)(*arguments + 0x110),sStack_1a0);
  }
  sStack_180 = sysbvm_type_canonicalizeDependentResultType(context,sStack_180);
  *(sysbvm_tuple_t *)(local_1a8 + 0x20) = sStack_180;
  uVar5 = *(ulong *)(local_1a8 + 0x60);
  if (uVar5 == 0 || (uVar5 & 0xf) != 0) {
    lVar2 = (long)uVar5 >> 4;
  }
  else {
    lVar2 = *(long *)(uVar5 + 0x10);
  }
  *(ulong *)(local_1a8 + 0x60) = lVar2 << 4 | 0x3b;
  sysbvm_stackFrame_popRecord(&local_160);
  sysbvm_stackFrame_popRecord(&local_148);
  sysbvm_stackFrame_popRecord(local_128);
  sVar3 = sysbvm_astFunctionApplicationNode_optimizePureApplication
                    (context,(sysbvm_astFunctionApplicationNode_t **)(arguments + 1));
  return sVar3;
}

Assistant:

static sysbvm_tuple_t sysbvm_dependentFunctionType_primitiveAnalyzeAndTypeCheckMessageSendNode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    sysbvm_dependentFunctionType_t **dependentFunctionType = (sysbvm_dependentFunctionType_t **)&arguments[0];
    sysbvm_tuple_t *node = &arguments[1];
    sysbvm_tuple_t *environment = &arguments[2];

    struct {
        sysbvm_astMessageSendNode_t *sendNode;

        sysbvm_tuple_t applicationEnvironment;
        sysbvm_tuple_t argumentNode;

        sysbvm_tuple_t applicationArgumentNode;
        sysbvm_tuple_t applicationArgumentValue;
        sysbvm_tuple_t resultType;

        sysbvm_tuple_t analyzedArgument;
        sysbvm_tuple_t analyzedArguments;
        sysbvm_tuple_t expectedArgumentType;
    } gcFrame = {
        .sendNode = (sysbvm_astMessageSendNode_t*)*node,
    };

    sysbvm_stackFrameFunctionActivationRecord_t functionActivationRecord = {
        .type = SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION,
    };
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t*)&functionActivationRecord); 
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.sendNode->super.sourcePosition);

    gcFrame.applicationEnvironment = sysbvm_functionActivationEnvironment_createForDependentFunctionType(context, SYSBVM_NULL_TUPLE, (sysbvm_tuple_t)*dependentFunctionType);

    size_t argumentNodeCount = sysbvm_array_getSize((*dependentFunctionType)->argumentNodes);
    
    size_t directEvaluationArgumentNodeCount = argumentNodeCount;

    size_t applicationArgumentCount = sysbvm_array_getSize(gcFrame.sendNode->arguments);
    size_t sourceArgumentIndex = 0;
    bool hasAnalyzedReceiver = false;

    gcFrame.analyzedArguments = sysbvm_array_create(context, applicationArgumentCount);
    for(size_t i = 0; i < directEvaluationArgumentNodeCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*dependentFunctionType)->argumentNodes, i);
        if(sysbvm_astArgumentNode_isForAll(argumentNodeCount))
        {
            sysbvm_error("TODO: Support forall argument types");
        }
        else
        {
            bool isReceiverArgument = !hasAnalyzedReceiver && gcFrame.sendNode->receiver;
            if(isReceiverArgument)
            {
                gcFrame.applicationArgumentNode = gcFrame.sendNode->receiver;
            }
            else
            {
                if(sourceArgumentIndex >= applicationArgumentCount)
                    sysbvm_error("Message send is missing required arguments.");
                gcFrame.applicationArgumentNode = sysbvm_array_at(gcFrame.sendNode->arguments, sourceArgumentIndex);
            }

            gcFrame.expectedArgumentType = sysbvm_interpreter_evaluateArgumentNodeTypeInEnvironment(context, gcFrame.argumentNode, &gcFrame.applicationEnvironment);
            gcFrame.analyzedArgument = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.applicationArgumentNode, gcFrame.expectedArgumentType, *environment);
            if(isReceiverArgument)
                gcFrame.sendNode->receiver = gcFrame.analyzedArgument;
            else
                sysbvm_array_atPut(gcFrame.analyzedArguments, sourceArgumentIndex, gcFrame.analyzedArgument);
            gcFrame.applicationArgumentValue = sysbvm_dependentFunctionType_getOrCreateDependentApplicationValueForNode(context, gcFrame.analyzedArgument);
            sysbvm_interpreter_bindArgumentNodeValueInEnvironment(context, i, &gcFrame.applicationEnvironment, gcFrame.applicationArgumentValue);
            if(isReceiverArgument)
                hasAnalyzedReceiver = true;
            else
                ++sourceArgumentIndex;
        }
    }

    if(sourceArgumentIndex != applicationArgumentCount)
        sysbvm_error("Message send is not receiving the expected number of arguments.");

    gcFrame.sendNode->arguments = gcFrame.analyzedArguments;

    if((*dependentFunctionType)->resultTypeNode)
        gcFrame.resultType = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*dependentFunctionType)->resultTypeNode, gcFrame.applicationEnvironment);
    gcFrame.resultType = sysbvm_type_canonicalizeDependentResultType(context, gcFrame.resultType);
    gcFrame.sendNode->super.analyzedType = gcFrame.resultType;
    gcFrame.sendNode->applicationFlags = sysbvm_tuple_bitflags_encode(sysbvm_tuple_bitflags_decode(gcFrame.sendNode->applicationFlags)
        | SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK | SYSBVM_FUNCTION_APPLICATION_FLAGS_VARIADIC_EXPANDED);

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&functionActivationRecord);  
    return sysbvm_astFunctionApplicationNode_optimizePureApplication(context, (sysbvm_astFunctionApplicationNode_t**)node);
}